

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O0

bool __thiscall sfc::Tile::operator==(Tile *this,Tile *other)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  Tile *other_local;
  Tile *this_local;
  
  bVar1 = std::operator==(&other->_data,&this->_data);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::empty(&this->_mirrors);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      __first = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::begin(&this->_mirrors);
      __last = std::
               vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::end(&this->_mirrors);
      this_local._7_1_ =
           std::operator==((__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            )__first._M_current,
                           (__normal_iterator<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            )__last._M_current,(anon_class_8_1_a86c6e30_for__M_pred)other);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tile::operator==(const Tile& other) const {
  if (other._data == _data)
    return true;
  if (!_mirrors.empty()) {
    return std::any_of(_mirrors.begin(), _mirrors.end(), [&](const auto& m) { return m == other._data; });
  }
  return false;
}